

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmMakefile.cxx
# Opt level: O2

void __thiscall cmMakefile::ConfigureFinalPass(cmMakefile *this)

{
  cmake *this_00;
  bool bVar1;
  char *lhss;
  allocator<char> local_31;
  string local_30;
  
  FinalPass(this);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_30,"CMAKE_BACKWARDS_COMPATIBILITY",&local_31);
  lhss = GetDefinition(this,&local_30);
  std::__cxx11::string::~string((string *)&local_30);
  if (lhss != (char *)0x0) {
    bVar1 = cmSystemTools::VersionCompare(OP_LESS,lhss,"2.4");
    if (bVar1) {
      this_00 = this->GlobalGenerator->CMakeInstance;
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_30,
                 "You have set CMAKE_BACKWARDS_COMPATIBILITY to a CMake version less than 2.4. This version of CMake only supports backwards compatibility with CMake 2.4 or later. For compatibility with older versions please use any CMake 2.8.x release or lower."
                 ,&local_31);
      cmake::IssueMessage(this_00,FATAL_ERROR,&local_30,&this->Backtrace);
      std::__cxx11::string::~string((string *)&local_30);
    }
  }
  return;
}

Assistant:

void cmMakefile::ConfigureFinalPass()
{
  this->FinalPass();
  const char* oldValue = this->GetDefinition("CMAKE_BACKWARDS_COMPATIBILITY");
  if (oldValue &&
      cmSystemTools::VersionCompare(cmSystemTools::OP_LESS, oldValue, "2.4")) {
    this->GetCMakeInstance()->IssueMessage(
      MessageType::FATAL_ERROR,
      "You have set CMAKE_BACKWARDS_COMPATIBILITY to a CMake version less "
      "than 2.4. This version of CMake only supports backwards compatibility "
      "with CMake 2.4 or later. For compatibility with older versions please "
      "use any CMake 2.8.x release or lower.",
      this->Backtrace);
  }
}